

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase * ResolveInitializerValue(ExpressionContext *ctx,SynBase *source,ExprBase *initializer)

{
  TypeFunction *type;
  FunctionData *function;
  ScopeData *pSVar1;
  Allocator *pAVar2;
  ArrayView<FunctionValue> functions;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  ExprBase *pEVar5;
  FunctionData *this;
  FunctionData *pFVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TypeBase *pTVar7;
  size_t sVar8;
  TypeBase *pTVar9;
  char *pcVar10;
  char *dst;
  InplaceStr name;
  FunctionValue bestOverload;
  undefined4 uStack_344;
  undefined1 local_340 [8];
  FunctionData *local_338;
  SynBase local_330 [12];
  Allocator *local_30;
  undefined4 extraout_var_00;
  
  if (initializer == (ExprBase *)0x0) {
    pcVar10 = "ERROR: auto variable must be initialized in place of definition";
    goto LAB_00165330;
  }
  type = (TypeFunction *)initializer->type;
  if (type == (TypeFunction *)ctx->typeVoid) {
    pcVar10 = "ERROR: r-value type is \'void\'";
    goto LAB_00165330;
  }
  if (((type != (TypeFunction *)0x0) && ((type->super_TypeBase).typeID == 0x15)) &&
     (GetFunctionForType((FunctionValue *)local_340,ctx,initializer->source,initializer,type),
     local_338 != (FunctionData *)0x0)) {
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
    initializer = (ExprBase *)CONCAT44(extraout_var,iVar4);
    ExprFunctionAccess::ExprFunctionAccess
              ((ExprFunctionAccess *)initializer,(SynBase *)local_340,
               &local_338->type->super_TypeBase,local_338,(ExprBase *)local_330[0]._vptr_SynBase);
  }
  iVar4 = *(int *)&((FunctionData *)initializer)->importModule;
  this = (FunctionData *)initializer;
  if (iVar4 == 0x27) {
    pTVar7 = ((FunctionData *)initializer)->contextType;
    if (pTVar7 == (TypeBase *)0x0) {
LAB_001653c9:
      pAVar2 = ctx->allocator;
      memset(local_330,0,0x300);
      local_338 = (FunctionData *)0x2000000000;
      local_340 = (undefined1  [8])local_330;
      local_30 = pAVar2;
      GetNodeFunctions(ctx,*(SynBase **)&((FunctionData *)initializer)->isInternal,initializer,
                       (SmallArray<FunctionValue,_32U> *)local_340);
      pcVar10 = ctx->errorBuf;
      if ((pcVar10 != (char *)0x0) && (ctx->errorBufSize != 0)) {
        if (ctx->errorCount == 0) {
          ctx->errorPos = (source->pos).begin;
          ctx->errorBufLocation = pcVar10;
          dst = pcVar10;
        }
        else {
          dst = ctx->errorBufLocation;
        }
        NULLC::SafeSprintf(dst,(ulong)(ctx->errorBufSize + ((int)pcVar10 - (int)dst)),
                           "ERROR: ambiguity, there is more than one overloaded function available:\n"
                          );
        pcVar10 = ctx->errorBufLocation;
        sVar8 = strlen(pcVar10);
        pcVar10 = pcVar10 + sVar8;
        ctx->errorBufLocation = pcVar10;
        functions.count = (uint)local_338;
        functions.data = (FunctionValue *)local_340;
        functions._12_4_ = uStack_344;
        ReportOnFunctionSelectError
                  (ctx,source,pcVar10,(*(int *)&ctx->errorBuf - (int)pcVar10) + ctx->errorBufSize,
                   dst,functions);
        pcVar10 = ctx->errorBufLocation;
        sVar8 = strlen(pcVar10);
        ctx->errorBufLocation = pcVar10 + sVar8;
      }
      if (ctx->errorHandlerActive == false) {
        __assert_fail("ctx.errorHandlerActive",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x20e0,
                      "ExprBase *ResolveInitializerValue(ExpressionContext &, SynBase *, ExprBase *)"
                     );
      }
      longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
    }
    iVar4 = 1;
    pTVar9 = pTVar7;
    do {
      pTVar9 = *(TypeBase **)&pTVar9->typeID;
      iVar4 = iVar4 + -1;
    } while (pTVar9 != (TypeBase *)0x0);
    if (iVar4 != 0) goto LAB_001653c9;
    function = (FunctionData *)pTVar7->_vptr_TypeBase;
    if (function->type->returnType == ctx->typeAuto) {
      pcVar10 = "ERROR: function type is unresolved at this point";
      goto LAB_00165330;
    }
    bVar3 = IsVirtualFunctionCall
                      (ctx,function,
                       *(TypeBase **)(*(long *)&((FunctionData *)initializer)->nameHash + 0x18));
    if (!bVar3) {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      this = (FunctionData *)CONCAT44(extraout_var_01,iVar4);
      ExprFunctionAccess::ExprFunctionAccess
                ((ExprFunctionAccess *)this,*(SynBase **)&((FunctionData *)initializer)->isInternal,
                 &function->type->super_TypeBase,function,
                 *(ExprBase **)&((FunctionData *)initializer)->nameHash);
      iVar4 = *(int *)&this->importModule;
      goto LAB_0016530d;
    }
    pEVar5 = GetFunctionTable(ctx,source,function);
    name.end = "";
    name.begin = "__redirect_ptr";
    this = (FunctionData *)
           CreateFunctionCall2(ctx,source,name,
                               *(ExprBase **)&((FunctionData *)initializer)->nameHash,pEVar5,false,
                               true,true);
    if ((this == (FunctionData *)0x0) || (*(int *)&this->importModule != 0)) {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pFVar6 = (FunctionData *)CONCAT44(extraout_var_00,iVar4);
      pSVar1 = (ScopeData *)function->type;
      *(uint *)&pFVar6->importModule = 0x12;
      *(SynBase **)&pFVar6->isInternal = source;
      pFVar6->scope = pSVar1;
      *(ExprBase **)&pFVar6->coroutine = (ExprBase *)0x0;
      *(bool *)&pFVar6->type = false;
      ((ExprBase *)&pFVar6->source)->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_002239e8;
      pFVar6->contextType = (TypeBase *)this;
      *(undefined4 *)&pFVar6->name = 0xd;
      iVar4 = 0x12;
      this = pFVar6;
    }
    else {
      iVar4 = 0;
    }
  }
  else {
LAB_0016530d:
    if (iVar4 == 0x25) goto LAB_001653b5;
  }
  if (*(bool *)((long)&this->scope->startOffset + 4) != true) {
    if (iVar4 != 0x17) {
      return (ExprBase *)this;
    }
    pcVar10 = "ERROR: target type of an \'auto ref\' cast is unknown";
LAB_00165330:
    anon_unknown.dwarf_9c70f::Report(ctx,source,pcVar10);
    iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
    pEVar5 = (ExprBase *)CONCAT44(extraout_var_02,iVar4);
    pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    pEVar5->typeID = 0;
    pEVar5->source = source;
    pEVar5->type = pTVar7;
    pEVar5->next = (ExprBase *)0x0;
    pEVar5->listed = false;
    pEVar5->_vptr_ExprBase = (_func_int **)&PTR__ExprError_00223b38;
    pEVar5[2]._vptr_ExprBase = (_func_int **)0x0;
    pEVar5[1]._vptr_ExprBase = (_func_int **)&pEVar5[1].source;
    *(undefined8 *)&pEVar5[1].typeID = 0x400000000;
    return pEVar5;
  }
LAB_001653b5:
  anon_unknown.dwarf_9c70f::Stop
            (ctx,source,
             "ERROR: cannot instantiate generic function, because target type is not known");
}

Assistant:

ExprBase* ResolveInitializerValue(ExpressionContext &ctx, SynBase *source, ExprBase *initializer)
{
	if(!initializer)
	{
		Report(ctx, source, "ERROR: auto variable must be initialized in place of definition");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	if(initializer->type == ctx.typeVoid)
	{
		Report(ctx, source, "ERROR: r-value type is 'void'");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	if(TypeFunction *target = getType<TypeFunction>(initializer->type))
	{
		if(FunctionValue bestOverload = GetFunctionForType(ctx, initializer->source, initializer, target))
			initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);
	}

	if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(initializer))
	{
		if(node->functions.size() == 1)
		{
			FunctionData *function = node->functions.head->function;

			if(function->type->returnType == ctx.typeAuto)
			{
				Report(ctx, source, "ERROR: function type is unresolved at this point");

				return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
			}

			if(IsVirtualFunctionCall(ctx, function, node->context->type))
			{
				ExprBase *table = GetFunctionTable(ctx, source, function);

				initializer = CreateFunctionCall2(ctx, source, InplaceStr("__redirect_ptr"), node->context, table, false, true, true);

				if(!isType<TypeError>(initializer))
					initializer = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, function->type, initializer, EXPR_CAST_REINTERPRET);
			}
			else
			{
				initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(initializer->source, function->type, function, node->context);
			}
		}
		else
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, initializer->source, initializer, functions);

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: ambiguity, there is more than one overloaded function available:\n");

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions);

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}

	if(isType<ExprGenericFunctionPrototype>(initializer) || initializer->type->isGeneric)
		Stop(ctx, source, "ERROR: cannot instantiate generic function, because target type is not known");

	if(isType<ExprUnboxing>(initializer))
	{
		Report(ctx, source, "ERROR: target type of an 'auto ref' cast is unknown");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	return initializer;
}